

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O1

void convert_expr_top(iasctx *ctx,easm_expr *expr)

{
  easm_expr_type eVar1;
  int iVar2;
  int iVar3;
  litem *plVar4;
  litem *plVar5;
  litem **pplVar6;
  litem *li;
  
  eVar1 = expr->type;
  plVar4 = (litem *)calloc(0x20,1);
  if (eVar1 == EASM_EXPR_SINSN) {
    plVar5 = (litem *)calloc(0x20,1);
    plVar4->type = LITEM_SESTART;
    plVar5->type = LITEM_SEEND;
    iVar2 = ctx->atomsmax;
    if (iVar2 <= ctx->atomsnum) {
      iVar3 = 0x10;
      if (iVar2 != 0) {
        iVar3 = iVar2 * 2;
      }
      ctx->atomsmax = iVar3;
      pplVar6 = (litem **)realloc(ctx->atoms,(long)iVar3 << 3);
      ctx->atoms = pplVar6;
    }
    iVar2 = ctx->atomsnum;
    ctx->atomsnum = iVar2 + 1;
    ctx->atoms[iVar2] = plVar4;
    convert_sinsn(ctx,expr->sinsn);
    iVar2 = ctx->atomsmax;
    if (iVar2 <= ctx->atomsnum) {
      iVar3 = 0x10;
      if (iVar2 != 0) {
        iVar3 = iVar2 * 2;
      }
      ctx->atomsmax = iVar3;
      pplVar6 = (litem **)realloc(ctx->atoms,(long)iVar3 << 3);
      ctx->atoms = pplVar6;
    }
  }
  else {
    plVar4->type = LITEM_EXPR;
    plVar4->expr = expr;
    iVar2 = ctx->atomsmax;
    plVar5 = plVar4;
    if (iVar2 <= ctx->atomsnum) {
      iVar3 = 0x10;
      if (iVar2 != 0) {
        iVar3 = iVar2 * 2;
      }
      ctx->atomsmax = iVar3;
      pplVar6 = (litem **)realloc(ctx->atoms,(long)iVar3 << 3);
      ctx->atoms = pplVar6;
    }
  }
  iVar2 = ctx->atomsnum;
  ctx->atomsnum = iVar2 + 1;
  ctx->atoms[iVar2] = plVar5;
  return;
}

Assistant:

void convert_expr_top(struct iasctx *ctx, struct easm_expr *expr) {
	if (expr->type == EASM_EXPR_SINSN) {
		struct litem *ses = calloc(sizeof *ses, 1);
		struct litem *see = calloc(sizeof *see, 1);
		ses->type = LITEM_SESTART;
		see->type = LITEM_SEEND;
		ADDARRAY(ctx->atoms, ses);
		convert_sinsn(ctx, expr->sinsn);
		ADDARRAY(ctx->atoms, see);
	} else {
		struct litem *li = calloc(sizeof *li, 1);
		li->type = LITEM_EXPR;
		li->expr = expr;
		ADDARRAY(ctx->atoms, li);
	}
}